

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O0

void __thiscall
andres::Partition<unsigned_long>::merge
          (Partition<unsigned_long> *this,Index element1,Index element2)

{
  ulong uVar1;
  Index __n;
  Index __n_00;
  reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Partition<unsigned_long> *in_stack_ffffffffffffffe0;
  value_type vVar3;
  
  __n = find(in_stack_ffffffffffffffe0,(Index)in_RDI);
  __n_00 = find(in_stack_ffffffffffffffe0,(Index)in_RDI);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI + 1,__n);
  vVar3 = *pvVar2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI + 1,__n_00)
  ;
  if (vVar3 < *pvVar2) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n);
    *pvVar2 = __n_00;
    in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + -1);
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI + 1,__n);
    uVar1 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI + 1,__n_00);
    if (*pvVar2 < uVar1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n_00)
      ;
      *pvVar2 = __n;
      in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)in_RDI[2].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + -1);
    }
    else if (__n != __n_00) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n_00)
      ;
      *pvVar2 = __n;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI + 1,__n);
      *pvVar2 = *pvVar2 + 1;
      in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)in_RDI[2].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + -1);
    }
  }
  return;
}

Assistant:

inline void 
Partition<T>::merge(
    Index element1,
    Index element2
) {
    // merge by rank
    element1 = find(element1);
    element2 = find(element2);
    if(ranks_[static_cast<std::size_t>(element1)] < ranks_[static_cast<std::size_t>(element2)]) {
        parents_[static_cast<std::size_t>(element1)] = element2;
        --numberOfSets_;
    }
    else if(ranks_[static_cast<std::size_t>(element1)] > ranks_[static_cast<std::size_t>(element2)]) {
        parents_[static_cast<std::size_t>(element2)] = element1;
        --numberOfSets_;
    }
    else if(element1 != element2) {
        parents_[static_cast<std::size_t>(element2)] = element1;
        ++ranks_[static_cast<std::size_t>(element1)];
        --numberOfSets_;
    }
}